

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O1

void __thiscall libDAI::IJGP::updateMessage(IJGP *this,size_t e)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long *plVar7;
  long *plVar8;
  Factor newmessage;
  Factor prod;
  TFactor<double> local_148;
  TFactor<double> local_110;
  TFactor<double> local_d8;
  TFactor<double> local_a0;
  TFactor<double> local_68;
  
  iVar6 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  lVar2 = *(long *)(*(long *)(CONCAT44(extraout_var,iVar6) + 0x110) + e * 0x10);
  iVar6 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  lVar3 = *(long *)(*(long *)(CONCAT44(extraout_var_00,iVar6) + 0x110) + 8 + e * 0x10);
  iVar6 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  TFactor<double>::TFactor
            (&local_110,
             (TFactor<double> *)(lVar2 * 0x40 + *(long *)(CONCAT44(extraout_var_01,iVar6) + 0xe0)));
  iVar6 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  plVar7 = *(long **)(*(long *)(CONCAT44(extraout_var_02,iVar6) + 0x140) + lVar2 * 0x18);
  while( true ) {
    iVar6 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if (plVar7 == *(long **)(*(long *)(CONCAT44(extraout_var_03,iVar6) + 0x140) + 8 + lVar2 * 0x18))
    break;
    if (*plVar7 != lVar3) {
      iVar6 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      plVar8 = *(long **)(*(long *)(CONCAT44(extraout_var_04,iVar6) + 0x158) + *plVar7 * 0x18);
      while( true ) {
        iVar6 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        lVar4 = *plVar7;
        if (plVar8 == *(long **)(*(long *)(CONCAT44(extraout_var_05,iVar6) + 0x158) + 8 +
                                lVar4 * 0x18)) break;
        lVar5 = *plVar8;
        if (lVar5 != lVar2) {
          iVar6 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          TFactor<double>::operator*=
                    (&local_110,
                     (this->_mes).
                     super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_06,iVar6) + 0x128) +
                                        lVar5 * 0x18) + lVar4 * 8));
        }
        plVar8 = plVar8 + 1;
      }
    }
    plVar7 = plVar7 + 1;
  }
  iVar6 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  TFactor<double>::marginal
            (&local_148,&local_110,
             (VarSet *)(lVar3 * 0x28 + *(long *)(CONCAT44(extraout_var_07,iVar6) + 0xf8)),true);
  dVar1 = (this->Props).damping;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    iVar6 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::operator^
              (&local_a0,
               (this->_mes).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_09,iVar6) + 0x128) + lVar2 * 0x18
                                  ) + lVar3 * 8),(this->Props).damping);
    TFactor<double>::operator^(&local_d8,&local_148,1.0 - (this->Props).damping);
    TFactor<double>::operator*(&local_68,&local_a0,&local_d8);
    iVar6 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::operator=
              ((this->_mes).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_10,iVar6) + 0x128) + lVar2 * 0x18
                                  ) + lVar3 * 8),&local_68);
    if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    iVar6 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::operator=
              ((this->_mes).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_08,iVar6) + 0x128) + lVar2 * 0x18
                                  ) + lVar3 * 8),&local_148);
  }
  if (local_148._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148._p._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148._p._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_148._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148._vs._vars.
                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110._p._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110._p._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110._vs._vars.
                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void IJGP::updateMessage(size_t e) {
        size_t alpha = grm().Redge(e).first;
        size_t beta = grm().Redge(e).second;
        
        Factor prod = grm().OR(alpha);
        for( RegionGraph::R_nb_cit beta2 = grm().nbOR(alpha).begin(); beta2 != grm().nbOR(alpha).end(); beta2++ )
            if( *beta2 != beta )
                for( RegionGraph::R_nb_cit alpha2 = grm().nbIR(*beta2).begin(); alpha2 != grm().nbIR(*beta2).end(); alpha2++ )
                    if( *alpha2 != alpha )
                        prod *= message(*alpha2, *beta2);
        Factor newmessage = prod.marginal( grm().IR(beta) );

        if( Props.damping == 0.0 )
            message(alpha, beta) = newmessage;
        else
            message(alpha, beta) = (message(alpha,beta) ^ Props.damping) * (newmessage ^ (1.0 - Props.damping));
    }